

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# config.c
# Opt level: O2

char * al_get_first_config_entry
                 (ALLEGRO_CONFIG *config,char *section,ALLEGRO_CONFIG_ENTRY **iterator)

{
  ALLEGRO_CONFIG_ENTRY *pAVar1;
  ALLEGRO_USTR *section_00;
  ALLEGRO_CONFIG_SECTION *pAVar2;
  ALLEGRO_CONFIG_ENTRY **ppAVar3;
  char *pcVar4;
  ALLEGRO_USTR_INFO section_info;
  ALLEGRO_USTR_INFO local_20;
  
  if (config == (ALLEGRO_CONFIG *)0x0) {
    return (char *)0x0;
  }
  pcVar4 = "";
  if (section != (char *)0x0) {
    pcVar4 = section;
  }
  section_00 = al_ref_cstr(&local_20,pcVar4);
  pAVar2 = find_section(config,section_00);
  if (pAVar2 != (ALLEGRO_CONFIG_SECTION *)0x0) {
    ppAVar3 = &pAVar2->head;
    while ((pAVar1 = *ppAVar3, pAVar1 != (ALLEGRO_CONFIG_ENTRY *)0x0 && (pAVar1->is_comment == true)
           )) {
      ppAVar3 = &pAVar1->next;
    }
    if (iterator != (ALLEGRO_CONFIG_ENTRY **)0x0) {
      *iterator = pAVar1;
    }
    if (pAVar1 != (ALLEGRO_CONFIG_ENTRY *)0x0) {
      pcVar4 = al_cstr(pAVar1->key);
      return pcVar4;
    }
  }
  return (char *)0x0;
}

Assistant:

char const *al_get_first_config_entry(ALLEGRO_CONFIG const *config,
   char const *section, ALLEGRO_CONFIG_ENTRY **iterator)
{
   ALLEGRO_USTR_INFO section_info;
   const ALLEGRO_USTR *usection;
   ALLEGRO_CONFIG_SECTION *s;
   ALLEGRO_CONFIG_ENTRY *e;

   if (!config)
      return NULL;

   if (section == NULL)
      section = "";

   usection = al_ref_cstr(&section_info, section);
   s = find_section(config, usection);
   if (!s)
      return NULL;
   e = s->head;
   while (e && e->is_comment)
      e = e->next;
   if (iterator) *iterator = e;
   return e ? al_cstr(e->key) : NULL;
}